

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargePropagator.cpp
# Opt level: O2

void __thiscall OpenMD::FluctuatingChargePropagator::initialize(FluctuatingChargePropagator *this)

{
  RealType rootEpsilon;
  SimInfo *info;
  FluctuatingChargeParameters *pFVar1;
  FluctuatingChargeConstraints *this_00;
  OptimizationFactory *this_01;
  OptimizationMethod *pOVar2;
  size_t maxIterations;
  NoConstraint noConstraint;
  DynamicVector<double,_std::allocator<double>_> initCoords;
  string chargeOptMethod;
  EndCriteria endCriteria;
  Problem problem;
  FluctuatingChargeObjectiveFunction flucQobjf;
  NoConstraint local_118;
  double local_108;
  undefined **local_100;
  _Vector_base<double,_std::allocator<double>_> local_f8;
  string local_e0;
  EndCriteria local_c0;
  FluctuatingChargeObjectiveFunction *local_98;
  undefined1 *local_90;
  _Vector_base<double,_std::allocator<double>_> local_88 [2];
  undefined ***local_58;
  FluctuatingChargeObjectiveFunction local_50;
  
  info = this->info_;
  if ((info->usesFluctuatingCharges_ == true) && (0 < info->nGlobalFluctuatingCharges_)) {
    this->hasFlucQ_ = true;
    this_00 = (FluctuatingChargeConstraints *)operator_new(0x88);
    FluctuatingChargeConstraints::FluctuatingChargeConstraints(this_00,info);
    this->fqConstraints_ = this_00;
    FluctuatingChargeConstraints::setConstrainRegions
              (this_00,(bool)(this->fqParams_->ConstrainRegions).super_ParameterBase.field_0x2b);
  }
  if ((this->hasFlucQ_ == true) &&
     ((this->fqParams_->DoInitialOptimization).super_ParameterBase.field_0x2b == '\x01')) {
    FluctuatingChargeObjectiveFunction::FluctuatingChargeObjectiveFunction
              (&local_50,this->info_,this->forceMan_,this->fqConstraints_);
    FluctuatingChargeObjectiveFunction::setInitialCoords
              ((DynamicVector<double,_std::allocator<double>_> *)&local_f8,&local_50);
    QuantLib::NoConstraint::NoConstraint(&local_118);
    local_100 = &PTR__StatusFunction_002c95b8;
    local_98 = &local_50;
    local_90 = (undefined1 *)&local_118;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_88,
               (vector<double,_std::allocator<double>_> *)&local_f8);
    local_58 = &local_100;
    pFVar1 = this->fqParams_;
    maxIterations = (size_t)*(int *)&(pFVar1->MaxIterations).super_ParameterBase.field_0x2c;
    rootEpsilon = (pFVar1->Tolerance).data_;
    local_108 = (pFVar1->InitialStepSize).data_;
    QuantLib::EndCriteria::EndCriteria
              (&local_c0,maxIterations,maxIterations,rootEpsilon,rootEpsilon,rootEpsilon);
    std::__cxx11::string::string
              ((string *)&local_e0,(string *)&(this->fqParams_->ChargeOptimizationMethod).data_);
    this_01 = OptimizationFactory::getInstance();
    pOVar2 = OptimizationFactory::createOptimization(this_01,&local_e0,this->info_);
    (*pOVar2->_vptr_OptimizationMethod[2])(local_108,pOVar2,&local_98,&local_c0);
    (*pOVar2->_vptr_OptimizationMethod[1])(pOVar2);
    std::__cxx11::string::~string((string *)&local_e0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(local_88);
    local_118.super_Constraint._vptr_Constraint = (_func_int **)&PTR__Constraint_002c2e38;
    if (local_118.super_Constraint.impl_ != (Impl *)0x0) {
      (*(local_118.super_Constraint.impl_)->_vptr_Impl[1])();
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f8);
  }
  this->initialized_ = true;
  return;
}

Assistant:

void FluctuatingChargePropagator::initialize() {
    if (info_->usesFluctuatingCharges()) {
      if (info_->getNFluctuatingCharges() > 0) {
        hasFlucQ_      = true;
        fqConstraints_ = new FluctuatingChargeConstraints(info_);
        fqConstraints_->setConstrainRegions(fqParams_->getConstrainRegions());
      }
    }

    if (!hasFlucQ_) {
      initialized_ = true;
      return;
    }

    // SimInfo::MoleculeIterator i;
    // Molecule::FluctuatingChargeIterator  j;
    // Molecule* mol;
    // Atom* atom;
    //
    // For single-minima flucq, this ensures a net neutral system, but
    // for multiple minima, this is no longer the right thing to do:
    //
    // for (mol = info_->beginMolecule(i); mol != NULL;
    //      mol = info_->nextMolecule(i)) {
    //   for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
    //        atom = mol->nextFluctuatingCharge(j)) {
    //     atom->setFlucQPos(0.0);
    //     atom->setFlucQVel(0.0);
    //   }
    // }

    if (fqParams_->getDoInitialOptimization()) {
      FluctuatingChargeObjectiveFunction flucQobjf(info_, forceMan_,
                                                   fqConstraints_);

      DynamicVector<RealType> initCoords = flucQobjf.setInitialCoords();

      NoConstraint noConstraint {};
      NoStatus noStatus {};

      Problem problem(flucQobjf, noConstraint, noStatus, initCoords);

      int maxIter              = fqParams_->getMaxIterations();
      RealType tolerance       = fqParams_->getTolerance();
      RealType initialStepSize = fqParams_->getInitialStepSize();

      EndCriteria endCriteria(maxIter, maxIter, tolerance, tolerance,
                              tolerance);
      std::string chargeOptMethod = fqParams_->getChargeOptimizationMethod();
      OptimizationMethod* minim =
          OptimizationFactory::getInstance().createOptimization(chargeOptMethod,
                                                                info_);

      minim->minimize(problem, endCriteria, initialStepSize);

      delete minim;
    }

    initialized_ = true;
  }